

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerBailOnEqualOrNotEqual
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut,
          PropertySymOpnd *propSymOpnd,bool isHelper)

{
  Instr *pIVar1;
  Func *func;
  bool bVar2;
  BailOutKind BVar3;
  int iVar4;
  JITTimeFunctionBody *pJVar5;
  undefined4 extraout_var;
  MemRefOpnd *pMVar6;
  IntConstOpnd *src2;
  IntConstOpnd *src2_00;
  IntConstOpnd *src2_01;
  LabelInstr *target;
  RegOpnd *dst;
  Instr *pIVar7;
  JITTimeProfileInfo *this_00;
  intptr_t iVar8;
  
  pIVar1 = instr->m_prev;
  LowerBailoutCheckAndLabel(this,instr,instr->m_opcode == BailOnEqual,isHelper);
  if (propSymOpnd != (PropertySymOpnd *)0x0) {
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if (((BVar3 & ~BailOutKindBits) == BailOutOnImplicitCalls) &&
       (propSymOpnd->m_inlineCacheIndex != 0xffffffff)) {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar5);
      if (bVar2) {
        func = this->m_func;
        iVar4 = (*func->m_threadContextInfo->_vptr_ThreadContextInfo[5])();
        pMVar6 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar4),TyUint8,func,
                                     AddrOpndKindDynamicMisc);
        src2 = IR::IntConstOpnd::New(4,TyUint8,instr->m_func,true);
        src2_00 = IR::IntConstOpnd::New(0xfe,TyUint8,instr->m_func,true);
        src2_01 = IR::IntConstOpnd::New(0x18,TyUint8,instr->m_func,true);
        target = IR::LabelInstr::New(Label,instr->m_func,true);
        dst = IR::RegOpnd::New(TyUint8,instr->m_func);
        pIVar7 = InsertAnd(&dst->super_Opnd,&pMVar6->super_Opnd,&src2_00->super_Opnd,instr);
        InsertTest(pIVar7->m_dst,&src2->super_Opnd,instr);
        InsertBranch(BrEq_A,false,target,instr);
        pJVar5 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
        this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar5);
        iVar8 = JITTimeProfileInfo::GetFldInfoAddr(this_00,propSymOpnd->m_inlineCacheIndex);
        pMVar6 = IR::MemRefOpnd::New(iVar8 + 2,TyInt8,instr->m_func,AddrOpndKindDynamicMisc);
        InsertOr(&pMVar6->super_Opnd,&pMVar6->super_Opnd,&src2_01->super_Opnd,instr);
        IR::Instr::InsertBefore(instr,&target->super_Instr);
      }
    }
  }
  GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnEqualOrNotEqual(IR::Instr * instr,
    IR::BranchInstr *branchInstr, // = nullptr
    IR::LabelInstr *labelBailOut, // = nullptr
    IR::PropertySymOpnd * propSymOpnd, // = nullptr
    bool isHelper)                // = false
{
    IR::Instr * prevInstr = instr->m_prev;

    // Bail out test
    bool onEqual = instr->m_opcode == Js::OpCode::BailOnEqual;

    LowerBailoutCheckAndLabel(instr, onEqual, isHelper);

    // BailOutOnImplicitCalls is a post-op bailout. Since we look at the profile info for LdFld/StFld to decide whether the instruction may or may not call an accessor,
    // we need to update this profile information on the bailout path for BailOutOnImplicitCalls if the implicit call was an accessor call.
    if(propSymOpnd && ((instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCalls) && (propSymOpnd->m_inlineCacheIndex != -1) &&
        instr->m_func->HasProfileInfo())
    {
        // result = AND implCallFlags, ~ImplicitCall_None
        //          TST result, ImplicitCall_Accessor
        //          JEQ $bail
        //          OR profiledFlags, ( FldInfo_FromAccessor | FldInfo_Polymorphic )
        //          $bail

        IR::Opnd * implicitCallFlags = GetImplicitCallFlagsOpnd();
        IR::Opnd * accessorImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_Accessor & ~Js::ImplicitCall_None, GetImplicitCallFlagsType(), instr->m_func, true);
        IR::Opnd * maskNoImplicitCall = IR::IntConstOpnd::New((Js::ImplicitCallFlags)~Js::ImplicitCall_None, GetImplicitCallFlagsType(), instr->m_func, true);
        IR::Opnd * fldInfoAccessor = IR::IntConstOpnd::New(Js::FldInfo_FromAccessor | Js::FldInfo_Polymorphic, GetFldInfoFlagsType(), instr->m_func, true);
        IR::LabelInstr * label = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, true);

        IR::Instr * andInstr = InsertAnd(IR::RegOpnd::New(GetImplicitCallFlagsType(), instr->m_func), implicitCallFlags, maskNoImplicitCall, instr);
        InsertTestBranch(andInstr->GetDst(), accessorImplicitCall, Js::OpCode::BrEq_A, label, instr);

        intptr_t infoAddr = instr->m_func->GetReadOnlyProfileInfo()->GetFldInfoAddr(propSymOpnd->m_inlineCacheIndex);

        IR::Opnd * profiledFlags = IR::MemRefOpnd::New(infoAddr + Js::FldInfo::GetOffsetOfFlags(), TyInt8, instr->m_func);

        InsertOr(profiledFlags, profiledFlags, fldInfoAccessor, instr);
        instr->InsertBefore(label);
    }

    this->GenerateBailOut(instr, branchInstr, labelBailOut);
    return prevInstr;
}